

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Material.cpp
# Opt level: O3

void __thiscall Assimp::AMFImporter::ParseNode_Texture(AMFImporter *this)

{
  size_t *psVar1;
  char *pcVar2;
  CAMFImporter_NodeElement *pCVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint32_t uVar7;
  undefined4 extraout_var_00;
  char *__s;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined7 extraout_var;
  _List_node_base *p_Var8;
  _List_node_base *p_Var9;
  runtime_error *prVar10;
  uint pAttrIdx;
  undefined1 **ppuVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  string an;
  string enc64_data;
  string id;
  string type;
  uint32_t local_dc;
  string local_d8;
  allocator<char> local_b1;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  uint local_94;
  string local_90;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  undefined4 extraout_var_01;
  
  local_70 = &local_60;
  local_68 = 0;
  local_60 = 0;
  local_50 = &local_40;
  local_48 = 0;
  local_40 = 0;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_a8 = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  uVar5 = (*this->mReader->_vptr_IIrrXMLReader[4])();
  if ((int)uVar5 < 1) {
    local_dc = 1;
    local_b0 = 0;
    local_a0 = 0;
  }
  else {
    local_dc = 1;
    local_a0 = 0;
    local_a8 = 0;
    pAttrIdx = 0;
    local_b0 = 0;
    local_94 = uVar5;
    do {
      iVar6 = (*this->mReader->_vptr_IIrrXMLReader[5])(this->mReader,(ulong)pAttrIdx);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,(char *)CONCAT44(extraout_var_00,iVar6),&local_b1);
      iVar6 = std::__cxx11::string::compare((char *)&local_d8);
      if (iVar6 == 0) {
        iVar6 = (*this->mReader->_vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_01,iVar6);
        ppuVar11 = &local_70;
LAB_003e2afe:
        pcVar2 = ppuVar11[1];
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)ppuVar11,0,pcVar2,(ulong)__s);
        uVar5 = local_94;
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)&local_d8);
        if (iVar6 == 0) {
          uVar7 = XML_ReadNode_GetAttrVal_AsU32(this,pAttrIdx);
          local_a0 = CONCAT44(extraout_var_02,uVar7);
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)&local_d8);
          if (iVar6 == 0) {
            uVar7 = XML_ReadNode_GetAttrVal_AsU32(this,pAttrIdx);
            local_a8 = CONCAT44(extraout_var_03,uVar7);
          }
          else {
            iVar6 = std::__cxx11::string::compare((char *)&local_d8);
            if (iVar6 == 0) {
              local_dc = XML_ReadNode_GetAttrVal_AsU32(this,pAttrIdx);
            }
            else {
              iVar6 = std::__cxx11::string::compare((char *)&local_d8);
              if (iVar6 == 0) {
                iVar6 = (*this->mReader->_vptr_IIrrXMLReader[6])();
                __s = (char *)CONCAT44(extraout_var_04,iVar6);
                ppuVar11 = &local_50;
                goto LAB_003e2afe;
              }
              iVar6 = std::__cxx11::string::compare((char *)&local_d8);
              if (iVar6 == 0) {
                bVar4 = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
                local_b0 = CONCAT71(extraout_var,bVar4);
              }
              else {
                Throw_IncorrectAttr(this,&local_d8);
              }
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      pAttrIdx = pAttrIdx + 1;
    } while (uVar5 != pAttrIdx);
    local_b0 = local_b0 & 0xffffffffffffff01;
  }
  paVar12 = &local_d8.field_2;
  p_Var8 = (_List_node_base *)operator_new(0x88);
  pCVar3 = this->mNodeElement_Cur;
  *(undefined4 *)&p_Var8->_M_prev = 0xc;
  p_Var8[1]._M_next = p_Var8 + 2;
  p_Var8[1]._M_prev = (_List_node_base *)0x0;
  *(undefined1 *)&p_Var8[2]._M_next = 0;
  p_Var8[3]._M_next = (_List_node_base *)pCVar3;
  p_Var8[4]._M_next = (_List_node_base *)&p_Var8[3]._M_prev;
  p_Var8[3]._M_prev = (_List_node_base *)&p_Var8[3]._M_prev;
  p_Var8[4]._M_prev = (_List_node_base *)0x0;
  p_Var8->_M_next = (_List_node_base *)&PTR__CAMFImporter_NodeElement_Texture_0080e698;
  p_Var8[5]._M_next = (_List_node_base *)0x0;
  p_Var8[5]._M_prev = (_List_node_base *)0x0;
  p_Var8[6]._M_next = (_List_node_base *)0x0;
  p_Var8[6]._M_prev = (_List_node_base *)0x0;
  p_Var8[7]._M_next = (_List_node_base *)0x0;
  p_Var8[7]._M_prev = (_List_node_base *)0x0;
  *(undefined1 *)&p_Var8[8]._M_next = 0;
  iVar6 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar6 == '\0') {
    XML_ReadNode_GetVal_AsString(this,&local_90);
  }
  if (local_68 == 0) {
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_d8._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"ID for texture must be defined.","");
    std::runtime_error::runtime_error(prVar10,(string *)&local_d8);
    *(undefined ***)prVar10 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar10,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((int)local_a0 == 0) {
    local_d8._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"width","");
    Throw_IncorrectAttrValue(this,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar12) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((int)local_a8 == 0) {
    local_d8._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"height","");
    Throw_IncorrectAttrValue(this,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar12) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_dc == 0) {
    local_d8._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"depth","");
    Throw_IncorrectAttrValue(this,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar12) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  iVar6 = std::__cxx11::string::compare((char *)&local_50);
  if (iVar6 != 0) {
    local_d8._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"type","");
    Throw_IncorrectAttrValue(this,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar12) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_90._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)(p_Var8 + 1));
    p_Var8[5]._M_next = (_List_node_base *)(local_a0 & 0xffffffff);
    p_Var8[5]._M_prev = (_List_node_base *)(local_a8 & 0xffffffff);
    p_Var8[6]._M_next = (_List_node_base *)(ulong)local_dc;
    *(char *)&p_Var8[8]._M_next = (char)local_b0;
    ParseHelper_Decode_Base64
              (this,&local_90,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var8[6]._M_prev);
    if ((long)p_Var8[7]._M_next - (long)p_Var8[6]._M_prev ==
        (ulong)((int)local_a8 * local_dc * (int)local_a0)) {
      pCVar3 = this->mNodeElement_Cur;
      p_Var9 = (_List_node_base *)operator_new(0x18);
      p_Var9[1]._M_next = p_Var8;
      std::__detail::_List_node_base::_M_hook(p_Var9);
      psVar1 = &(pCVar3->Child).
                super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      p_Var9 = (_List_node_base *)operator_new(0x18);
      p_Var9[1]._M_next = p_Var8;
      std::__detail::_List_node_base::_M_hook(p_Var9);
      psVar1 = &(this->mNodeElement_List).
                super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,
                        CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                 local_90.field_2._M_local_buf[0]) + 1);
      }
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
      }
      return;
    }
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_d8._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"Texture has incorrect data size.","");
    std::runtime_error::runtime_error(prVar10,(string *)&local_d8);
    *(undefined ***)prVar10 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar10,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_d8._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"Texture data not defined.","");
  std::runtime_error::runtime_error(prVar10,(string *)&local_d8);
  *(undefined ***)prVar10 = &PTR__runtime_error_0080bf48;
  __cxa_throw(prVar10,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AMFImporter::ParseNode_Texture()
{
    std::string id;
    uint32_t width = 0;
    uint32_t height = 0;
    uint32_t depth = 1;
    std::string type;
    bool tiled = false;
    std::string enc64_data;

	// Read attributes for node <color>.
	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECK_RET("id", id, mReader->getAttributeValue);
		MACRO_ATTRREAD_CHECK_RET("width", width, XML_ReadNode_GetAttrVal_AsU32);
		MACRO_ATTRREAD_CHECK_RET("height", height, XML_ReadNode_GetAttrVal_AsU32);
		MACRO_ATTRREAD_CHECK_RET("depth", depth, XML_ReadNode_GetAttrVal_AsU32);
		MACRO_ATTRREAD_CHECK_RET("type", type, mReader->getAttributeValue);
		MACRO_ATTRREAD_CHECK_RET("tiled", tiled, XML_ReadNode_GetAttrVal_AsBool);
	MACRO_ATTRREAD_LOOPEND;

	// create new texture object.
    CAMFImporter_NodeElement *ne = new CAMFImporter_NodeElement_Texture(mNodeElement_Cur);

	CAMFImporter_NodeElement_Texture& als = *((CAMFImporter_NodeElement_Texture*)ne);// alias for convenience

	// Check for child nodes
    if (!mReader->isEmptyElement()) {
        XML_ReadNode_GetVal_AsString(enc64_data);
    }

	// check that all components was defined
    if (id.empty()) {
        throw DeadlyImportError("ID for texture must be defined.");
    }
    if (width < 1) {
        Throw_IncorrectAttrValue("width");
    }
    if (height < 1) {
        Throw_IncorrectAttrValue("height");
    }
    if (depth < 1) {
        Throw_IncorrectAttrValue("depth");
    }
    if (type != "grayscale") {
        Throw_IncorrectAttrValue("type");
    }
    if (enc64_data.empty()) {
        throw DeadlyImportError("Texture data not defined.");
    }
	// copy data
	als.ID = id;
	als.Width = width;
	als.Height = height;
	als.Depth = depth;
	als.Tiled = tiled;
	ParseHelper_Decode_Base64(enc64_data, als.Data);

    // check data size
    if ((width * height * depth) != als.Data.size()) {
        throw DeadlyImportError("Texture has incorrect data size.");
    }

	mNodeElement_Cur->Child.push_back(ne);// Add element to child list of current element
	mNodeElement_List.push_back(ne);// and to node element list because its a new object in graph.
}